

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::SetUseUtf8StringEscaping(Printer *this,bool as_utf8)

{
  undefined8 *puVar1;
  byte in_SIL;
  FastFieldValuePrinter *in_stack_ffffffffffffff98;
  Printer *in_stack_ffffffffffffffa0;
  
  if ((in_SIL & 1) == 0) {
    in_stack_ffffffffffffffa0 = (Printer *)operator_new(8);
    FastFieldValuePrinter::FastFieldValuePrinter((FastFieldValuePrinter *)in_stack_ffffffffffffffa0)
    ;
  }
  else {
    puVar1 = (undefined8 *)operator_new(8);
    *puVar1 = 0;
    anon_unknown_19::FastFieldValuePrinterUtf8Escaping::FastFieldValuePrinterUtf8Escaping
              ((FastFieldValuePrinterUtf8Escaping *)in_stack_ffffffffffffffa0);
  }
  SetDefaultFieldValuePrinter(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void TextFormat::Printer::SetUseUtf8StringEscaping(bool as_utf8) {
  SetDefaultFieldValuePrinter(as_utf8 ? new FastFieldValuePrinterUtf8Escaping()
                                      : new FastFieldValuePrinter());
}